

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_set.cpp
# Opt level: O0

void __thiscall
SetFixture_InsertLeafStore_Test::~SetFixture_InsertLeafStore_Test
          (SetFixture_InsertLeafStore_Test *this)

{
  SetFixture_InsertLeafStore_Test *this_local;
  
  ~SetFixture_InsertLeafStore_Test(this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_F (SetFixture, InsertLeafStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_.insert (t1, "a"s);
    index_.flush (t1, db_.get_current_revision ());

    const_iterator begin = index_.cbegin (db_);
    const_iterator end = index_.cend (db_);
    EXPECT_NE (begin, end);
    std::string const & v1 = (*begin);
    EXPECT_EQ ("a", v1);
    begin++;
    EXPECT_EQ (begin, end);
}